

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexMatch.cpp
# Opt level: O1

unique_ptr<const_oout::Result,_std::default_delete<const_oout::Result>_> __thiscall
oout::RegexMatch::match(RegexMatch *this,shared_ptr<const_oout::Text> *in)

{
  ostream *poVar1;
  TestResult *this_00;
  undefined8 *in_RDX;
  string origin;
  ostringstream message;
  bool local_219;
  CondResult *local_218;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_210;
  undefined1 local_208 [32];
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  long local_1e0;
  long local_1d8 [2];
  shared_ptr<const_oout::Result> local_1c8;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  (**(code **)(*(long *)*in_RDX + 0x10))(&local_1e8);
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"\'",1);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,local_1e8._M_current,local_1e0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\' match with \'",0xe);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)(in->
                                     super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>
                                     )._M_refcount._M_pi,
                      (long)in[1].super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\'",1);
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_1b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(in->super___shared_ptr<const_oout::Text,_(__gnu_cxx::_Lock_policy)2>)._M_refcount,
             0x10);
  local_208._16_8_ = (pointer)0x0;
  local_208._24_8_ = (char *)0x0;
  local_208._0_8_ = (pointer)0x0;
  local_208._8_8_ = (pointer)0x0;
  local_219 = std::__detail::
              __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                        (local_1e8,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(local_1e8._M_current + local_1e0),
                         (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)local_208,&local_1b8,0);
  if ((pointer)local_208._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
  }
  std::__cxx11::stringbuf::str();
  local_218 = (CondResult *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<oout::CondResult,std::allocator<oout::CondResult>,bool,std::__cxx11::string>
            (&_Stack_210,&local_218,(allocator<oout::CondResult> *)&local_1c8,&local_219,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_208);
  this_00 = (TestResult *)operator_new(0x18);
  local_1c8.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_218->super_Result;
  local_1c8.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Stack_210._M_pi;
  local_218 = (CondResult *)0x0;
  _Stack_210._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  TestResult::TestResult(this_00,&local_1c8);
  if (local_1c8.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1c8.super___shared_ptr<const_oout::Result,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  (this->super_Match)._vptr_Match = (_func_int **)this_00;
  if (_Stack_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_210._M_pi);
  }
  if ((pointer)local_208._0_8_ != (pointer)(local_208 + 0x10)) {
    operator_delete((void *)local_208._0_8_,(ulong)(local_208._16_8_ + 1));
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  if ((long *)local_1e8._M_current != local_1d8) {
    operator_delete(local_1e8._M_current,local_1d8[0] + 1);
  }
  return (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         (__uniq_ptr_data<const_oout::Result,_std::default_delete<const_oout::Result>,_true,_true>)
         this;
}

Assistant:

unique_ptr<const Result> RegexMatch::match(const shared_ptr<const Text> &in) const
{
	const auto origin = in->asString();
	ostringstream message;
	message << "'" << origin << "' match with '" << re << "'";

	return make_unique<TestResult>(
		make_shared<CondResult>(regex_search(origin, regex(re)), message.str())
	);
}